

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qotd.cc
# Opt level: O0

void unescapeQuote(string *quote)

{
  ulong uVar1;
  string *psVar2;
  allocator local_71;
  string local_70 [8];
  string replacement;
  allocator local_39;
  string local_38 [8];
  string target;
  size_t position;
  string *quote_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"\\n",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"\n",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)quote,(ulong)local_38);
    if (uVar1 == 0xffffffffffffffff) break;
    psVar2 = (string *)std::__cxx11::string::length();
    std::__cxx11::string::replace((ulong)quote,uVar1,psVar2);
    std::__cxx11::string::length();
  }
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void unescapeQuote( std::string& quote )
{
  std::size_t position    = 0;
  std::string target      = "\\n";
  std::string replacement = "\n";
  while( ( position = quote.find( target, position ) ) != std::string::npos )
  {
    quote.replace( position, target.length(), replacement );
    position += replacement.length();
  }
}